

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_math.c
# Opt level: O1

realtype SUNRpowerI(realtype base,int exponent)

{
  int iVar1;
  realtype rVar2;
  
  rVar2 = 1.0;
  if (exponent != 0) {
    iVar1 = -exponent;
    if (0 < exponent) {
      iVar1 = exponent;
    }
    rVar2 = 1.0;
    do {
      rVar2 = rVar2 * base;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  if (exponent < 0) {
    rVar2 = 1.0 / rVar2;
  }
  return rVar2;
}

Assistant:

realtype SUNRpowerI(realtype base, int exponent)
{
  int i, expt;
  realtype prod;

  prod = ONE;
  expt = abs(exponent);
  for(i = 1; i <= expt; i++) prod *= base;
  if (exponent < 0) prod = ONE/prod;
  return(prod);
}